

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O1

void __thiscall
VW::config::typed_option<char>::typed_option(typed_option<char> *this,typed_option<char> *param_1)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->super_base_option)._vptr_base_option = (_func_int **)&PTR__base_option_002eb540;
  (this->super_base_option).m_name._M_dataplus._M_p =
       (pointer)&(this->super_base_option).m_name.field_2;
  pcVar1 = (param_1->super_base_option).m_name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_base_option).m_name,pcVar1,
             pcVar1 + (param_1->super_base_option).m_name._M_string_length);
  (this->super_base_option).m_type_hash = (param_1->super_base_option).m_type_hash;
  (this->super_base_option).m_help._M_dataplus._M_p =
       (pointer)&(this->super_base_option).m_help.field_2;
  pcVar1 = (param_1->super_base_option).m_help._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_base_option).m_help,pcVar1,
             pcVar1 + (param_1->super_base_option).m_help._M_string_length);
  (this->super_base_option).m_short_name._M_dataplus._M_p =
       (pointer)&(this->super_base_option).m_short_name.field_2;
  pcVar1 = (param_1->super_base_option).m_short_name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_base_option).m_short_name,pcVar1,
             pcVar1 + (param_1->super_base_option).m_short_name._M_string_length);
  (this->super_base_option).m_keep = (param_1->super_base_option).m_keep;
  (this->super_base_option)._vptr_base_option = (_func_int **)&PTR__typed_option_002eb598;
  this->m_location = param_1->m_location;
  (this->m_value).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (param_1->m_value).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (param_1->m_value).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->m_value).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->m_default_value).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (param_1->m_default_value).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (param_1->m_default_value).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_default_value).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

typed_option(const std::string& name, T& location) : base_option(name, typeid(T).hash_code()), m_location{location} {}